

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlxContext.cpp
# Opt level: O2

void __thiscall
sf::priv::GlxContext::updateSettingsFromVisualInfo(GlxContext *this,XVisualInfo *visualInfo)

{
  bool bVar1;
  int samples;
  int multiSampling;
  int stencil;
  int depth;
  int sRgb;
  
  (*sf_glad_glXGetConfig)(this->m_display,visualInfo,0xc,&depth);
  (*sf_glad_glXGetConfig)(this->m_display,visualInfo,0xd,&stencil);
  if (SF_GLAD_GLX_ARB_multisample == 0) {
    multiSampling = 0;
    samples = 0;
  }
  else {
    (*sf_glad_glXGetConfig)(this->m_display,visualInfo,100000,&multiSampling);
    (*sf_glad_glXGetConfig)(this->m_display,visualInfo,0x186a1,&samples);
  }
  if (SF_GLAD_GLX_ARB_framebuffer_sRGB == 0 && SF_GLAD_GLX_EXT_framebuffer_sRGB == 0) {
    bVar1 = false;
  }
  else {
    (*sf_glad_glXGetConfig)(this->m_display,visualInfo,0x20b2,&sRgb);
    bVar1 = sRgb == 1;
  }
  (this->super_GlContext).m_settings.depthBits = depth;
  (this->super_GlContext).m_settings.stencilBits = stencil;
  if (multiSampling != 0) {
    multiSampling = samples;
  }
  (this->super_GlContext).m_settings.antialiasingLevel = multiSampling;
  (this->super_GlContext).m_settings.sRgbCapable = bVar1;
  return;
}

Assistant:

void GlxContext::updateSettingsFromVisualInfo(XVisualInfo* visualInfo)
{
    // Update the creation settings from the chosen format
    int depth, stencil, multiSampling, samples, sRgb;
    glXGetConfig(m_display, visualInfo, GLX_DEPTH_SIZE,   &depth);
    glXGetConfig(m_display, visualInfo, GLX_STENCIL_SIZE, &stencil);

    if (SF_GLAD_GLX_ARB_multisample)
    {
        glXGetConfig(m_display, visualInfo, GLX_SAMPLE_BUFFERS_ARB, &multiSampling);
        glXGetConfig(m_display, visualInfo, GLX_SAMPLES_ARB,        &samples);
    }
    else
    {
        multiSampling = 0;
        samples = 0;
    }

    if (SF_GLAD_GLX_EXT_framebuffer_sRGB || SF_GLAD_GLX_ARB_framebuffer_sRGB)
    {
        glXGetConfig(m_display, visualInfo, GLX_FRAMEBUFFER_SRGB_CAPABLE_ARB, &sRgb);
    }
    else
    {
        sRgb = 0;
    }

    m_settings.depthBits         = static_cast<unsigned int>(depth);
    m_settings.stencilBits       = static_cast<unsigned int>(stencil);
    m_settings.antialiasingLevel = multiSampling ? static_cast<unsigned int>(samples) : 0;
    m_settings.sRgbCapable       = (sRgb == True);
}